

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_16_3_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  v128 row1_1;
  v128 row0_1;
  int i_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  int local_6f4;
  int local_684;
  int dir_local;
  int sec_strength_local;
  int pri_strength_local;
  uint16_t *in_local;
  int dstride_local;
  void *dest_local;
  v128 res_128;
  v128 row1;
  v128 row0;
  int i;
  uint16_t *dst16;
  uint8_t *dst8;
  
  if (block_width == 8) {
    for (local_6f4 = 0; local_6f4 < block_height; local_6f4 = local_6f4 + 2) {
      uVar1 = *(undefined8 *)(in + local_6f4 * 0x90 + 4);
      uVar2 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90);
      uVar3 = *(undefined8 *)(in + (local_6f4 + 1) * 0x90 + 4);
      puVar4 = (undefined8 *)((long)dest + (long)(local_6f4 * dstride) * 2);
      *puVar4 = *(undefined8 *)(in + local_6f4 * 0x90);
      puVar4[1] = uVar1;
      puVar4 = (undefined8 *)((long)dest + (long)((local_6f4 + 1) * dstride) * 2);
      *puVar4 = uVar2;
      puVar4[1] = uVar3;
    }
  }
  else {
    for (local_684 = 0; local_684 < block_height; local_684 = local_684 + 4) {
      uVar1 = *(undefined8 *)(in + (local_684 * 0x90 + 0x90));
      uVar2 = *(undefined8 *)(in + (local_684 * 0x90 + 0x120));
      uVar3 = *(undefined8 *)(in + (local_684 * 0x90 + 0x1b0));
      *(undefined8 *)((long)dest + (long)(local_684 * dstride) * 2) =
           *(undefined8 *)(in + local_684 * 0x90);
      *(undefined8 *)((long)dest + (long)((local_684 + 1) * dstride) * 2) = uVar1;
      *(undefined8 *)((long)dest + (long)((local_684 + 2) * dstride) * 2) = uVar2;
      *(undefined8 *)((long)dest + (long)((local_684 + 3) * dstride) * 2) = uVar3;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_3)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  (void)pri_strength;
  (void)sec_strength;
  (void)dir;
  (void)pri_damping;
  (void)sec_damping;
  (void)coeff_shift;
  (void)block_width;
  if (block_width == 8) {
    copy_block_8xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  } else {
    copy_block_4xh(/*is_lowbd=*/0, dest, dstride, in, block_height);
  }
}